

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg4.c
# Opt level: O3

wchar_t borg_mon_blow_effect(char *name)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 8;
  do {
    iVar1 = strcmp(name,*(char **)((long)&PTR_borg_spell_ratings_BLACKGUARD_002c6668 + lVar2));
    if (iVar1 == 0) {
      return *(wchar_t *)((long)&borg_mon_blow_effect::monblow[0].name + lVar2);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1f8);
  return L'\0';
}

Assistant:

int borg_mon_blow_effect(const char* name)
{
    static const struct {
        const char*       name;
        enum BORG_MONBLOW val;
    } monblow[] = { { "NONE", MONBLOW_NONE }, { "HURT", MONBLOW_HURT },
        { "POISON", MONBLOW_POISON }, { "DISENCHANT", MONBLOW_DISENCHANT },
        { "DRAIN_CHARGES", MONBLOW_DRAIN_CHARGES },
        { "EAT_GOLD", MONBLOW_EAT_GOLD }, { "EAT_ITEM", MONBLOW_EAT_ITEM },
        { "EAT_FOOD", MONBLOW_EAT_FOOD }, { "EAT_LIGHT", MONBLOW_EAT_LIGHT },
        { "ACID", MONBLOW_ACID }, { "ELEC", MONBLOW_ELEC },
        { "FIRE", MONBLOW_FIRE }, { "COLD", MONBLOW_COLD },
        { "BLIND", MONBLOW_BLIND }, { "CONFUSE", MONBLOW_CONFUSE },
        { "TERRIFY", MONBLOW_TERRIFY }, { "PARALYZE", MONBLOW_PARALYZE },
        { "LOSE_STR", MONBLOW_LOSE_STR }, { "LOSE_INT", MONBLOW_LOSE_INT },
        { "LOSE_WIS", MONBLOW_LOSE_WIS }, { "LOSE_DEX", MONBLOW_LOSE_DEX },
        { "LOSE_CON", MONBLOW_LOSE_CON }, { "LOSE_ALL", MONBLOW_LOSE_ALL },
        { "SHATTER", MONBLOW_SHATTER }, { "EXP_10", MONBLOW_EXP_10 },
        { "EXP_20", MONBLOW_EXP_20 }, { "EXP_40", MONBLOW_EXP_40 },
        { "EXP_80", MONBLOW_EXP_80 }, { "HALLU", MONBLOW_HALLU },
        { "BLACK_BREATH", MONBLOW_BLACK_BREATH }, { NULL, MONBLOW_NONE } };
    unsigned long i;
    for (i = 0; i < sizeof(monblow) / sizeof(monblow[0]); ++i)
        if (!strcmp(name, monblow[i].name))
            return monblow[i].val;
    return MONBLOW_NONE;
}